

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O0

int __thiscall CASC_CSV::GetString(CASC_CSV *this,char *szBufferPtr,size_t nMaxChars,size_t Index)

{
  char *pcVar1;
  size_t sVar2;
  char *szBufferEnd;
  char *szStringEnd;
  char *szStringPtr;
  size_t Index_local;
  size_t nMaxChars_local;
  char *szBufferPtr_local;
  CASC_CSV *this_local;
  
  if (Index < this->nColumns) {
    if (nMaxChars - 1 < this->Columns[Index].nLength) {
      this_local._4_4_ = 0x69;
    }
    else {
      pcVar1 = this->Columns[Index].szString;
      sVar2 = this->Columns[Index].nLength;
      szStringEnd = pcVar1;
      nMaxChars_local = (size_t)szBufferPtr;
      while (szStringEnd < pcVar1 + sVar2 && nMaxChars_local < szBufferPtr + (nMaxChars - 1)) {
        *(char *)nMaxChars_local = *szStringEnd;
        szStringEnd = szStringEnd + 1;
        nMaxChars_local = nMaxChars_local + 1;
      }
      *(undefined1 *)nMaxChars_local = 0;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0x69;
  }
  return this_local._4_4_;
}

Assistant:

int CASC_CSV::GetString(char * szBufferPtr, size_t nMaxChars, size_t Index)
{
    const char * szStringPtr;
    const char * szStringEnd;
    char * szBufferEnd = szBufferPtr + nMaxChars - 1;

    // Check for index overflow and buffer overflow
    if (Index >= nColumns)
        return ERROR_INSUFFICIENT_BUFFER;
    if (Columns[Index].nLength > nMaxChars - 1)
        return ERROR_INSUFFICIENT_BUFFER;
    
    // Get the source string
    szStringPtr = Columns[Index].szString;
    szStringEnd = szStringPtr + Columns[Index].nLength;

    // Copy the string
    while (szStringPtr < szStringEnd && szBufferPtr < szBufferEnd)
        *szBufferPtr++ = *szStringPtr++;
    szBufferPtr[0] = 0;
    return ERROR_SUCCESS;
}